

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNStmIf::gen_code(CTPNStmIf *this,int param_1,int param_2)

{
  CTcPrsNode *pCVar1;
  _func_int *p_Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CTcCodeLabel *lbl;
  CTcCodeLabel *pCVar4;
  CTPNStm *pCVar5;
  CTcCodeLabel *lbl_else;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  iVar3 = (*(((this->super_CTPNStmIfBase).cond_expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1]
          )();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    pCVar5 = (this->super_CTPNStmIfBase).then_part_;
    if ((this->super_CTPNStmIfBase).else_part_ != (CTPNStm *)0x0 || pCVar5 != (CTPNStm *)0x0) {
      lbl = CTcCodeStream::new_label_fwd(G_cs);
      pCVar1 = (this->super_CTPNStmIfBase).cond_expr_;
      p_Var2 = (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x14];
      if (pCVar5 == (CTPNStm *)0x0) {
        (*p_Var2)(pCVar1,lbl,0);
        CTPNStmBase::gen_code_substm((CTPNStmBase *)this,(this->super_CTPNStmIfBase).else_part_);
      }
      else {
        (*p_Var2)(pCVar1,0,lbl);
        CTPNStmBase::gen_code_substm((CTPNStmBase *)this,(this->super_CTPNStmIfBase).then_part_);
        if ((this->super_CTPNStmIfBase).else_part_ != (CTPNStm *)0x0) {
          pCVar4 = CTcPrsNode::gen_jump_ahead(0x91);
          CTcPrsNode::def_label_pos(lbl);
          CTPNStmBase::gen_code_substm((CTPNStmBase *)this,(this->super_CTPNStmIfBase).else_part_);
          lbl = pCVar4;
        }
      }
      CTcPrsNode::def_label_pos(lbl);
      return;
    }
    pCVar1 = (this->super_CTPNStmIfBase).cond_expr_;
    (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,1,1);
    return;
  }
  iVar3 = (*(((this->super_CTPNStmIfBase).cond_expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1]
          )();
  if ((((CTcConstVal *)CONCAT44(extraout_var_00,iVar3))->typ_ == TC_CVT_NIL) ||
     (iVar3 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_00,iVar3)), iVar3 != 0))
  {
    iVar3 = (*(((this->super_CTPNStmIfBase).cond_expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
              [1])();
    if ((*(byte *)(CONCAT44(extraout_var_01,iVar3) + 0x20) & 1) == 0) {
      CTPNStmBase::log_warning((CTPNStmBase *)this,0x2d02);
    }
    pCVar5 = (this->super_CTPNStmIfBase).else_part_;
  }
  else {
    if ((this->super_CTPNStmIfBase).else_part_ != (CTPNStm *)0x0) {
      CTPNStmBase::log_warning((CTPNStmBase *)this,0x2d01);
    }
    pCVar5 = (this->super_CTPNStmIfBase).then_part_;
  }
  if (pCVar5 == (CTPNStm *)0x0) {
    return;
  }
  CTPNStmBase::gen_code_substm((CTPNStmBase *)this,pCVar5);
  return;
}

Assistant:

void CTPNStmIf::gen_code(int, int)
{
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   if the condition has a constant value, don't bother generating
     *   code for both branches 
     */
    if (cond_expr_->is_const())
    {
        int val;

        /* determine whether it's true or false */
        val = cond_expr_->get_const_val()->get_val_bool();
        
        /* 
         *   Warn about it if it's always false (in which case the 'then'
         *   code is unreachable); or it's always true and we have an
         *   'else' part (since the 'else' part is unreachable).  Don't
         *   warn if it's true and there's no 'else' part, since this
         *   merely means that there's some redundant source code, but
         *   will have no effect on the generated code.  
         */
        if (!val)
        {
            /* 
             *   It's false - the 'then' part cannot be executed.  If this
             *   isn't a compile-time constant expression, warn about it.
             */
            if (!cond_expr_->get_const_val()->is_ctc())
                log_warning(TCERR_IF_ALWAYS_FALSE);

            /* generate the 'else' part if there is one */
            if (else_part_ != 0)
                gen_code_substm(else_part_);
        }
        else
        {
            /* it's true - the 'else' part cannot be executed */
            if (else_part_ != 0)
                log_warning(TCERR_IF_ALWAYS_TRUE);

            /* generate the 'then' part */
            if (then_part_ != 0)
                gen_code_substm(then_part_);
        }

        /* we're done */
        return;
    }

    /*
     *   If both the 'then' and 'else' parts are null statements, we're
     *   evaluating the condition purely for side effects.  Simply
     *   evaluate the condition in this case, since there's no need to so
     *   much as test the condition once evaluated. 
     */
    if (then_part_ == 0 && else_part_ == 0)
    {
        /* generate the condition, discarding the result */
        cond_expr_->gen_code(TRUE, TRUE);

        /* we're done */
        return;
    }

    /* 
     *   The condition is non-constant, and we have at least one subclause,
     *   so we must evaluate the condition expression.  To minimize the
     *   amount of jumping, check whether we have a true part, else part, or
     *   both, and generate the branching accordingly.  
     */
    if (then_part_ != 0)
    {
        CTcCodeLabel *lbl_else;
        CTcCodeLabel *lbl_end;

        /*
         *   We have a true part, so we will want to evaluate the expression
         *   and jump past the true part if the expression is false.  Create
         *   a label for the false branch.  
         */
        lbl_else = G_cs->new_label_fwd();

        /* generate the condition expression */
        cond_expr_->gen_code_cond(0, lbl_else);

        /* generate the 'then' part */
        gen_code_substm(then_part_);

        /* if there's an 'else' part, generate it */
        if (else_part_ != 0)
        {
            /* at the end of the 'then' part, jump past the 'else' part */
            lbl_end = gen_jump_ahead(OPC_JMP);

            /* this is the start of the 'else' part */
            def_label_pos(lbl_else);

            /* generate the 'else' part */
            gen_code_substm(else_part_);

            /* set the label for the jump over the 'else' part */
            def_label_pos(lbl_end);
        }
        else
        {
            /* 
             *   there's no 'else' part - set the label for the jump past the
             *   'then' part 
             */
            def_label_pos(lbl_else);
        }
    }
    else
    {
        CTcCodeLabel *lbl_end;

        /* 
         *   There's no 'then' part, so there must be an 'else' part (we
         *   wouldn't have gotten this far if both 'then' and 'else' are
         *   empty).  To minimize branching, evaluate the condition and jump
         *   past the 'else' part if the condition is true, falling through
         *   to the 'else' part otherwise.  Create a label for the end of the
         *   statement, which is also the empty 'then' part.  
         */
        lbl_end = G_cs->new_label_fwd();

        /* evaluate the condition and jump to the end if it's true */
        cond_expr_->gen_code_cond(lbl_end, 0);

        /* generate the 'else' part */
        gen_code_substm(else_part_);

        /* set the label for the jump over the 'else' part */
        def_label_pos(lbl_end);
    }
}